

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::PrimitiveColumnWriter::Prepare
          (PrimitiveColumnWriter *this,ColumnWriterState *state_p,ColumnWriterState *parent,
          Vector *vector,idx_t count)

{
  ValidityMask *this_00;
  int64_t *piVar1;
  pointer *this_01;
  uint16_t define_value;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar7;
  PageInformation *page_info;
  size_type __n;
  idx_t iVar8;
  unsigned_long val;
  bool bVar9;
  reference rVar10;
  PageInformation new_info;
  value_type local_58;
  
  pvVar4 = vector<duckdb_parquet::ColumnChunk,_true>::get<true>
                     ((vector<duckdb_parquet::ColumnChunk,_true> *)
                      (state_p[1].definition_levels.
                       super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),
                      (size_type)
                      state_p[1].definition_levels.
                      super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (parent == (ColumnWriterState *)0x0) {
    __n = (long)(state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start >> 1;
    val = count;
  }
  else {
    __n = (long)(state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start >> 1;
    val = ((long)(parent->definition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(parent->definition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start >> 1) - __n;
  }
  FlatVector::VerifyFlatVector(vector);
  this_00 = &vector->validity;
  ColumnWriter::HandleRepeatLevels
            (&this->super_ColumnWriter,state_p,parent,count,
             ((this->super_ColumnWriter).column_schema)->max_repeat);
  define_value = (uint16_t)((this->super_ColumnWriter).column_schema)->max_define;
  ColumnWriter::HandleDefineLevels
            (&this->super_ColumnWriter,state_p,parent,this_00,count,define_value,define_value - 1);
  this_01 = &state_p[1].definition_levels.
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  pvVar5 = vector<duckdb::PageInformation,_true>::back
                     ((vector<duckdb::PageInformation,_true> *)this_01);
  lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
  piVar1 = &(pvVar4->meta_data).num_values;
  *piVar1 = *piVar1 + lVar6;
  if ((parent == (ColumnWriterState *)0x0) ||
     ((bVar2 = true,
      (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p ==
      (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_p &&
      ((parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_offset == 0)))) {
    if (((this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
        ) && (bVar2 = TypeIsConstantSize((vector->type).physical_type_), bVar2)) {
      iVar8 = pvVar5->estimated_page_size;
      bVar2 = false;
      iVar3 = (*(this->super_ColumnWriter)._vptr_ColumnWriter[0xe])(this,vector,0,state_p);
      if (CONCAT44(extraout_var,iVar3) * val + iVar8 < 0x6400000) {
        pvVar5->row_count = pvVar5->row_count + val;
        iVar3 = (*(this->super_ColumnWriter)._vptr_ColumnWriter[0xe])(this,vector,0,state_p);
        pvVar5->estimated_page_size =
             pvVar5->estimated_page_size + CONCAT44(extraout_var_00,iVar3) * val;
        return;
      }
    }
    else {
      bVar2 = false;
    }
  }
  iVar8 = 0;
  while (bVar9 = val != 0, val = val - 1, bVar9) {
    pvVar5->row_count = pvVar5->row_count + 1;
    if ((bVar2) &&
       (rVar10 = vector<bool,_true>::get<true>(&parent->is_empty,__n),
       (*rVar10._M_p & rVar10._M_mask) != 0)) {
      pvVar5->empty_count = pvVar5->empty_count + 1;
    }
    else {
      bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&this_00->super_TemplatedValidityMask<unsigned_long>,iVar8);
      if (bVar9) {
        iVar3 = (*(this->super_ColumnWriter)._vptr_ColumnWriter[0xe])(this,vector,iVar8,state_p);
        uVar7 = CONCAT44(extraout_var_01,iVar3) + pvVar5->estimated_page_size;
        pvVar5->estimated_page_size = uVar7;
        if (0x63fffff < uVar7) {
          local_58.empty_count = 0;
          local_58.estimated_page_size = 0;
          local_58.row_count = 0;
          local_58.null_count = 0;
          local_58.offset = pvVar5->row_count + pvVar5->offset;
          ::std::vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>::
          push_back((vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_> *)
                    this_01,&local_58);
          pvVar5 = vector<duckdb::PageInformation,_true>::back
                             ((vector<duckdb::PageInformation,_true> *)this_01);
        }
      }
      else {
        pvVar5->null_count = pvVar5->null_count + 1;
      }
      iVar8 = iVar8 + 1;
    }
    __n = __n + 1;
  }
  return;
}

Assistant:

void PrimitiveColumnWriter::Prepare(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector,
                                    idx_t count) {
	auto &state = state_p.Cast<PrimitiveColumnWriterState>();
	auto &col_chunk = state.row_group.columns[state.col_idx];

	idx_t vcount = parent ? parent->definition_levels.size() - state.definition_levels.size() : count;
	idx_t parent_index = state.definition_levels.size();
	auto &validity = FlatVector::Validity(vector);
	HandleRepeatLevels(state, parent, count, MaxRepeat());
	HandleDefineLevels(state, parent, validity, count, MaxDefine(), MaxDefine() - 1);

	idx_t vector_index = 0;
	reference<PageInformation> page_info_ref = state.page_info.back();
	col_chunk.meta_data.num_values += NumericCast<int64_t>(vcount);

	const bool check_parent_empty = parent && !parent->is_empty.empty();
	if (!check_parent_empty && validity.AllValid() && TypeIsConstantSize(vector.GetType().InternalType()) &&
	    page_info_ref.get().estimated_page_size + GetRowSize(vector, vector_index, state) * vcount <
	        MAX_UNCOMPRESSED_PAGE_SIZE) {
		// Fast path: fixed-size type, all valid, and it fits on the current page
		auto &page_info = page_info_ref.get();
		page_info.row_count += vcount;
		page_info.estimated_page_size += GetRowSize(vector, vector_index, state) * vcount;
	} else {
		for (idx_t i = 0; i < vcount; i++) {
			auto &page_info = page_info_ref.get();
			page_info.row_count++;
			if (check_parent_empty && parent->is_empty[parent_index + i]) {
				page_info.empty_count++;
				continue;
			}
			if (validity.RowIsValid(vector_index)) {
				page_info.estimated_page_size += GetRowSize(vector, vector_index, state);
				if (page_info.estimated_page_size >= MAX_UNCOMPRESSED_PAGE_SIZE) {
					PageInformation new_info;
					new_info.offset = page_info.offset + page_info.row_count;
					state.page_info.push_back(new_info);
					page_info_ref = state.page_info.back();
				}
			} else {
				page_info.null_count++;
			}
			vector_index++;
		}
	}
}